

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmtr.c
# Opt level: O0

pid_t id_peer(int fd,char **name)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  ssize_t sVar4;
  char local_58 [8];
  char path [30];
  int local_30;
  socklen_t len;
  int i;
  int sc;
  int rc;
  ucred ucred;
  char **name_local;
  int fd_local;
  
  exe[0] = '\0';
  *name = exe;
  stack0xffffffffffffffcc = 0xc;
  ucred._4_8_ = name;
  iVar1 = getsockopt(fd,1,0x11,&sc,(socklen_t *)(path + 0x1c));
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    syslog(3,"getsockopt: %s\n",pcVar3);
    name_local._4_4_ = 0;
  }
  else {
    snprintf(local_58,0x1e,"/proc/%u/exe",(ulong)(uint)sc);
    sVar4 = readlink(local_58,exe,99);
    local_30 = (int)sVar4;
    if (-1 < local_30) {
      if (local_30 < 1) {
        __assert_fail("sc > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/troydhanson[P]pmtr/src/pmtr.c"
                      ,0xb6,"pid_t id_peer(int, char **)");
      }
      exe[local_30] = '\0';
      do {
        iVar1 = local_30;
        local_30 = iVar1 + -1;
        if (local_30 < 0) goto LAB_0010c483;
      } while (exe[local_30] != '/');
      *(char **)ucred._4_8_ = exe + iVar1;
    }
LAB_0010c483:
    name_local._4_4_ = sc;
  }
  return name_local._4_4_;
}

Assistant:

pid_t id_peer(int fd, char **name) {
  struct ucred ucred;
  int rc = -1, sc, i;
  socklen_t len;

  *exe = '\0';
  *name = exe;

  len = sizeof(struct ucred);
  sc = getsockopt(fd, SOL_SOCKET, SO_PEERCRED, &ucred, &len);
  if (sc < 0) {
    syslog(LOG_ERR, "getsockopt: %s\n", strerror(errno));
    return (pid_t)0;
  }

  /* try to lookup the executable name from /proc/<pid>/exe */
  char path[30];
  snprintf(path, sizeof(path), "/proc/%u/exe", (unsigned)ucred.pid);
  sc = readlink(path, exe, sizeof(exe)-1);
  if (sc < 0) {
    /* allow failure here, /proc filesystem not present? */
    //syslog(LOG_ERR, "readlink: %s\n", strerror(errno));
  } else {
    /* readlink does not null-terminate its output. do so */
    assert(sc > 0);
    exe[sc] = '\0';
    /* lastly, take basename() of the target */
    for(i = sc-1; i >= 0; i--) {
      if (exe[i] == '/') {
        *name = &exe[i+1];
        break;
      }
    }

  }
  return ucred.pid;
}